

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  ztsaver_t **savers_00;
  ztloader_t **loaders_00;
  ztstruct_t *unaff_retaddr;
  char *syntax_error;
  ztloader_t *loaders [1];
  ztsaver_t *savers [1];
  sub_t sub;
  ztregion_t regions [1];
  example_t example;
  char *tenbyte;
  ztresult_t rc;
  long local_a8;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 uVar2;
  ztregion_t *regions_00;
  undefined4 uVar3;
  int iVar4;
  
  uVar2 = (undefined1)((uint)in_stack_ffffffffffffffc0 >> 0x18);
  uVar3 = 0;
  savers_00 = (ztsaver_t **)malloc(10);
  if (savers_00 == (ztsaver_t **)0x0) {
    iVar4 = 1;
  }
  else {
    loaders_00 = (ztloader_t **)((long)savers_00 + 5);
    iVar4 = 0;
    regions_00 = (ztregion_t *)popular_beat_combo[3];
    uVar1 = zt_save((ztstruct_t *)0x3e0000003d,&pointed_at,
                    (char *)CONCAT44(in_stack_ffffffffffffff9c,0x2a),
                    (ztregion_t *)CONCAT44(in_stack_ffffffffffffff94,10),0,savers_00,
                    CONCAT13(uVar2,0x2e2d2c));
    if (uVar1 == 0) {
      memset(&stack0xffffffffffffff98,0x55,0x58);
      uVar1 = zt_load(unaff_retaddr,(void *)CONCAT44(uVar3,uVar1),(char *)savers_00,regions_00,iVar4
                      ,loaders_00,(int)syntax_error,(char **)loaders[0]);
      if (uVar1 == 0) {
        iVar4 = 0;
      }
      else {
        fprintf(_stderr,"zt_load failed (%d)\n",(ulong)uVar1);
        if (local_a8 != 0) {
          fprintf(_stderr,"syntax error: %s\n",local_a8);
          zt_freesyntax((char *)0x1014bf);
        }
        iVar4 = 1;
      }
    }
    else {
      fprintf(_stderr,"zt_save failed (%d)\n",(ulong)uVar1);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int main(void)
{
#ifdef __riscos
  static const char testfile[] = "demo_zt";
#else
  static const char testfile[] = "demo.zt";
#endif

  ztresult_t  rc;
  char       *tenbyte;
  example_t   example;
  ztregion_t  regions[1]; /* descriptions of heap blocks */
  sub_t       sub;
  ztsaver_t  *savers[1];
  ztloader_t *loaders[1];
  char       *syntax_error;

  tenbyte = malloc(10);
  if (tenbyte == NULL)
    return EXIT_FAILURE;

  sub.value = 51;

  example.integer               = 42;
  example.pointer_to_integer    = &pointed_at;
  example.integer_array[0]      = 61;
  example.integer_array[1]      = 62;
  example.integer_array[2]      = 63;
  example.inline_sub.value      = 43;
  example.pointer_to_sub        = &sub;
  example.array_of_sub[0].value = 44;
  example.array_of_sub[1].value = 45;
  example.array_of_sub[2].value = 46;
  example.static_pointer        = &example_array[2];
  example.static_nullpointer     = NULL;
  example.pointer               = &tenbyte[5];
  example.nullpointer            = NULL;
  example.string_in_array       = popular_beat_combo[3];

  regions[0].id                 = tenbyte_id;
  regions[0].spec.base          = tenbyte;
  regions[0].spec.length        = 10;
  regions[0].spec.nelems        = 10;

  savers[CUSTOMTYPE_BAND_MEMBER] = bandmember_saver;
  rc = zt_save(&example_meta,
               &example,
                testfile,
               &regions[0],
                NELEMS(regions),
                savers,
                NELEMS(savers));
  if (rc != ztresult_OK)
  {
    fprintf(stderr, "zt_save failed (%d)\n", rc);
    return EXIT_FAILURE;
  }

  /* Setup the example structure layout (but not the values themselves) */
  memset(&example, 0x55, sizeof(example_t));
  example.pointer_to_integer    = &pointed_at;
  example.pointer_to_sub        = &sub;

  loaders[CUSTOMTYPE_BAND_MEMBER] = bandmember_loader;
  rc = zt_load(&example_meta,
               &example,
                testfile,
               &regions[0],
                NELEMS(regions),
                loaders,
               NELEMS(loaders),
               &syntax_error);
  if (rc != ztresult_OK)
  {
    fprintf(stderr, "zt_load failed (%d)\n", rc);
    if (syntax_error)
    {
      fprintf(stderr, "syntax error: %s\n", syntax_error);
      zt_freesyntax(syntax_error);
    }
    return EXIT_FAILURE;
  }

  assert(example.integer == 42);
  assert(pointed_at == 33);
  assert(example.integer_array[0] == 61);
  assert(example.integer_array[1] == 62);
  assert(example.integer_array[2] == 63);
  assert(example.inline_sub.value == 43);
  assert(example.pointer_to_sub->value == 51);
  assert(example.array_of_sub[0].value == 44);
  assert(example.array_of_sub[1].value == 45);
  assert(example.array_of_sub[2].value == 46);
  assert(example.static_pointer == &example_array[2]);
  assert(example.static_nullpointer == NULL);
  assert(example.pointer == &tenbyte[5]);
  assert(example.nullpointer == NULL);
  assert(example.string_in_array == popular_beat_combo[3]);

  return EXIT_SUCCESS;
}